

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

string * __thiscall
vkt::ubo::(anonymous_namespace)::generateVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ShaderInterface *interface,
          UniformLayout *layout,
          map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
          *blockPointers,MatrixLoadFlags matrixLoadFlag,bool shuffleUniformMembers)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  char *pcVar4;
  ostream *poVar5;
  reference ppSVar6;
  UniformBlock *this_00;
  UniformBlock *block;
  int blockNdx;
  __normal_iterator<const_vkt::ubo::StructType_**,_std::vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>_>
  local_1e8;
  __normal_iterator<const_vkt::ubo::StructType_**,_std::vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>_>
  local_1e0;
  __normal_iterator<const_vkt::ubo::StructType_*const_*,_std::vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>_>
  local_1d8;
  const_iterator structIter;
  vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_> namedStructs;
  ostringstream local_1a8 [8];
  ostringstream src;
  bool shuffleUniformMembers_local;
  MatrixLoadFlags matrixLoadFlag_local;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  *blockPointers_local;
  UniformLayout *layout_local;
  ShaderInterface *interface_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar5 = std::operator<<((ostream *)local_1a8,pcVar4);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)local_1a8,"layout(location = 0) in highp vec4 a_position;\n");
  std::operator<<((ostream *)local_1a8,"layout(location = 0) out mediump float v_vtxResult;\n");
  std::operator<<((ostream *)local_1a8,"\n");
  std::vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>::vector
            ((vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_> *)
             &structIter);
  ShaderInterface::getNamedStructs
            ((ShaderInterface *)this,
             (vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_> *)
             &structIter);
  local_1e0._M_current =
       (StructType **)
       std::vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>::
       begin((vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_> *)
             &structIter);
  __gnu_cxx::
  __normal_iterator<vkt::ubo::StructType_const*const*,std::vector<vkt::ubo::StructType_const*,std::allocator<vkt::ubo::StructType_const*>>>
  ::__normal_iterator<vkt::ubo::StructType_const**>
            ((__normal_iterator<vkt::ubo::StructType_const*const*,std::vector<vkt::ubo::StructType_const*,std::allocator<vkt::ubo::StructType_const*>>>
              *)&local_1d8,&local_1e0);
  while( true ) {
    local_1e8._M_current =
         (StructType **)
         std::vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>::
         end((vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_> *)
             &structIter);
    bVar1 = __gnu_cxx::operator!=(&local_1d8,&local_1e8);
    if (!bVar1) break;
    ppSVar6 = __gnu_cxx::
              __normal_iterator<const_vkt::ubo::StructType_*const_*,_std::vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>_>
              ::operator*(&local_1d8);
    ubo::anon_unknown_0::generateDeclaration((ostringstream *)local_1a8,*ppSVar6,0);
    __gnu_cxx::
    __normal_iterator<const_vkt::ubo::StructType_*const_*,_std::vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>_>
    ::operator++(&local_1d8,0);
  }
  block._4_4_ = 0;
  while( true ) {
    iVar2 = ShaderInterface::getNumUniformBlocks((ShaderInterface *)this);
    if (iVar2 <= block._4_4_) break;
    this_00 = ShaderInterface::getUniformBlock((ShaderInterface *)this,block._4_4_);
    dVar3 = UniformBlock::getFlags(this_00);
    if ((dVar3 & 0x200) != 0) {
      ubo::anon_unknown_0::generateDeclaration
                ((ostringstream *)local_1a8,block._4_4_,this_00,(UniformLayout *)interface,
                 (bool)((byte)matrixLoadFlag & 1));
    }
    block._4_4_ = block._4_4_ + 1;
  }
  std::operator<<((ostream *)local_1a8,"\n");
  ubo::anon_unknown_0::generateCompareFuncs((ostream *)local_1a8,(ShaderInterface *)this);
  std::operator<<((ostream *)local_1a8,
                  "\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tmediump float result = 1.0;\n"
                 );
  ubo::anon_unknown_0::generateCompareSrc
            ((ostringstream *)local_1a8,"result",(ShaderInterface *)this,(UniformLayout *)interface,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             layout,true,(MatrixLoadFlags)blockPointers);
  std::operator<<((ostream *)local_1a8,"\tv_vtxResult = result;\n}\n");
  std::__cxx11::ostringstream::str();
  std::vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>::~vector
            ((vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_> *)
             &structIter);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string generateVertexShader (const ShaderInterface& interface, const UniformLayout& layout, const std::map<int, void*>& blockPointers, MatrixLoadFlags matrixLoadFlag, bool shuffleUniformMembers)
{
	std::ostringstream src;
	src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n";

	src << "layout(location = 0) in highp vec4 a_position;\n";
	src << "layout(location = 0) out mediump float v_vtxResult;\n";
	src << "\n";

	std::vector<const StructType*> namedStructs;
	interface.getNamedStructs(namedStructs);
	for (std::vector<const StructType*>::const_iterator structIter = namedStructs.begin(); structIter != namedStructs.end(); structIter++)
		generateDeclaration(src, **structIter, 0);

	for (int blockNdx = 0; blockNdx < interface.getNumUniformBlocks(); blockNdx++)
	{
		const UniformBlock& block = interface.getUniformBlock(blockNdx);
		if (block.getFlags() & DECLARE_VERTEX)
			generateDeclaration(src, blockNdx, block, layout, shuffleUniformMembers);
	}

	// Comparison utilities.
	src << "\n";
	generateCompareFuncs(src, interface);

	src << "\n"
		   "void main (void)\n"
		   "{\n"
		   "	gl_Position = a_position;\n"
		   "	mediump float result = 1.0;\n";

	// Value compare.
	generateCompareSrc(src, "result", interface, layout, blockPointers, true, matrixLoadFlag);

	src << "	v_vtxResult = result;\n"
		   "}\n";

	return src.str();
}